

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall
soul::heart::Parser::scanStateVariable(Parser *this,ScannedTopLevelItem *item,bool isConstant)

{
  iterator __position;
  UTF8Reader local_10;
  
  local_10.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  __position._M_current =
       (item->stateVariableDecls).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (item->stateVariableDecls).
      super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
    _M_realloc_insert<soul::UTF8Reader>(&item->stateVariableDecls,__position,&local_10);
  }
  else {
    (__position._M_current)->data = local_10.data;
    (item->stateVariableDecls).
    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  skipPastNextOccurrenceOf(this,(TokenType)0x2585e7);
  return;
}

Assistant:

void scanStateVariable (ScannedTopLevelItem& item, bool isConstant)
    {
        ignoreUnused (isConstant);

        item.stateVariableDecls.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }